

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O3

PVG_FT_Fixed PVG_FT_Vector_Length(PVG_FT_Vector *vec)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  PVG_FT_Fixed s;
  ulong uVar8;
  long lVar9;
  int iVar10;
  PVG_FT_Vector local_28;
  
  uVar2 = vec->x;
  uVar3 = vec->y;
  if (uVar2 == 0) {
    uVar6 = -uVar3;
    if (0 < (long)uVar3) {
      uVar6 = uVar3;
    }
  }
  else {
    uVar6 = -uVar2;
    if (0 < (long)uVar2) {
      uVar6 = uVar2;
    }
    if (uVar3 != 0) {
      uVar8 = -uVar3;
      if (0 < (long)uVar3) {
        uVar8 = uVar3;
      }
      uVar4 = (uint)uVar6 | (uint)uVar8;
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (uVar1 < 0x1e) {
        iVar10 = 0x1d - uVar1;
        local_28.x = uVar2 << ((byte)iVar10 & 0x3f);
        local_28.y = uVar3 << ((byte)iVar10 & 0x3f);
      }
      else {
        iVar10 = (uVar1 ^ 0x1f) - 2;
        bVar7 = 2 - (char)(uVar1 ^ 0x1f);
        local_28.x = (long)uVar2 >> (bVar7 & 0x3f);
        local_28.y = (long)uVar3 >> (bVar7 & 0x3f);
      }
      ft_trig_pseudo_polarize(&local_28);
      lVar5 = -local_28.x;
      if (0 < local_28.x) {
        lVar5 = local_28.x;
      }
      lVar9 = lVar5 * 0xdbd95b16 + 0x100000000 >> 0x20;
      lVar5 = -lVar9;
      if (-1 < local_28.x) {
        lVar5 = lVar9;
      }
      bVar7 = (byte)iVar10;
      if (iVar10 < 1) {
        uVar6 = (ulong)(uint)((int)lVar5 << (-bVar7 & 0x1f));
      }
      else {
        uVar6 = (long)(lVar5 + (ulong)(uint)(1 << (bVar7 - 1 & 0x1f))) >> (bVar7 & 0x3f);
      }
    }
  }
  return uVar6;
}

Assistant:

PVG_FT_Fixed PVG_FT_Vector_Length(PVG_FT_Vector* vec)
{
    PVG_FT_Int    shift;
    PVG_FT_Vector v;

    v = *vec;

    /* handle trivial cases */
    if (v.x == 0) {
        return PVG_FT_ABS(v.y);
    } else if (v.y == 0) {
        return PVG_FT_ABS(v.x);
    }

    /* general case */
    shift = ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    v.x = ft_trig_downscale(v.x);

    if (shift > 0) return (v.x + (1 << (shift - 1))) >> shift;

    return (PVG_FT_Fixed)((PVG_FT_UInt32)v.x << -shift);
}